

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void buildshifts(lemon *lemp,state *stp)

{
  int iVar1;
  config *pcVar2;
  symbol *sp;
  rule *rp;
  int iVar3;
  config **ppcVar4;
  config *pcVar5;
  state *arg;
  config *cfp;
  int i;
  long lVar6;
  config **ppcVar7;
  
  ppcVar7 = &stp->cfp;
  ppcVar4 = ppcVar7;
  while (pcVar2 = *ppcVar4, pcVar2 != (config *)0x0) {
    pcVar2->status = INCOMPLETE;
    ppcVar4 = &pcVar2->next;
  }
  while (pcVar2 = *ppcVar7, pcVar2 != (config *)0x0) {
    if ((pcVar2->status != COMPLETE) && (pcVar2->dot < pcVar2->rp->nrhs)) {
      Configlist_reset();
      sp = pcVar2->rp->rhs[pcVar2->dot];
      for (cfp = pcVar2; cfp != (config *)0x0; cfp = cfp->next) {
        if (cfp->status != COMPLETE) {
          iVar1 = cfp->dot;
          rp = cfp->rp;
          if (iVar1 < rp->nrhs) {
            iVar3 = same_symbol(rp->rhs[iVar1],sp);
            if (iVar3 != 0) {
              cfp->status = COMPLETE;
              pcVar5 = Configlist_addbasis(rp,iVar1 + 1);
              Plink_add(&pcVar5->bplp,cfp);
            }
          }
        }
      }
      arg = getstate(lemp);
      if (sp->type == MULTITERMINAL) {
        for (lVar6 = 0; lVar6 < sp->nsubsym; lVar6 = lVar6 + 1) {
          Action_add(&stp->ap,SHIFT,sp->subsym[lVar6],(char *)arg);
        }
      }
      else {
        Action_add(&stp->ap,SHIFT,sp,(char *)arg);
      }
    }
    ppcVar7 = &pcVar2->next;
  }
  return;
}

Assistant:

PRIVATE void buildshifts(struct lemon *lemp, struct state *stp)
{
  struct config *cfp;  /* For looping thru the config closure of "stp" */
  struct config *bcfp; /* For the inner loop on config closure of "stp" */
  struct config *newcfg;  /* */
  struct symbol *sp;   /* Symbol following the dot in configuration "cfp" */
  struct symbol *bsp;  /* Symbol following the dot in configuration "bcfp" */
  struct state *newstp; /* A pointer to a successor state */

  /* Each configuration becomes complete after it contibutes to a successor
  ** state.  Initially, all configurations are incomplete */
  for(cfp=stp->cfp; cfp; cfp=cfp->next) cfp->status = INCOMPLETE;

  /* Loop through all configurations of the state "stp" */
  for(cfp=stp->cfp; cfp; cfp=cfp->next){
    if( cfp->status==COMPLETE ) continue;    /* Already used by inner loop */
    if( cfp->dot>=cfp->rp->nrhs ) continue;  /* Can't shift this config */
    Configlist_reset();                      /* Reset the new config set */
    sp = cfp->rp->rhs[cfp->dot];             /* Symbol after the dot */

    /* For every configuration in the state "stp" which has the symbol "sp"
    ** following its dot, add the same configuration to the basis set under
    ** construction but with the dot shifted one symbol to the right. */
    for(bcfp=cfp; bcfp; bcfp=bcfp->next){
      if( bcfp->status==COMPLETE ) continue;    /* Already used */
      if( bcfp->dot>=bcfp->rp->nrhs ) continue; /* Can't shift this one */
      bsp = bcfp->rp->rhs[bcfp->dot];           /* Get symbol after dot */
      if( !same_symbol(bsp,sp) ) continue;      /* Must be same as for "cfp" */
      bcfp->status = COMPLETE;                  /* Mark this config as used */
      newcfg = Configlist_addbasis(bcfp->rp,bcfp->dot+1);
      Plink_add(&newcfg->bplp,bcfp);
    }

    /* Get a pointer to the state described by the basis configuration set
    ** constructed in the preceding loop */
    newstp = getstate(lemp);

    /* The state "newstp" is reached from the state "stp" by a shift action
    ** on the symbol "sp" */
    if( sp->type==MULTITERMINAL ){
      int i;
      for(i=0; i<sp->nsubsym; i++){
        Action_add(&stp->ap,SHIFT,sp->subsym[i],(char*)newstp);
      }
    }else{
      Action_add(&stp->ap,SHIFT,sp,(char *)newstp);
    }
  }
}